

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O0

bool __thiscall DSDcc::DSDNXDN::UDCH::decode(UDCH *this)

{
  ostream *this_00;
  long lVar1;
  int iVar2;
  CNXDNConvolution *in_RDI;
  uint8_t s1;
  uint8_t s0;
  uint i;
  int n;
  CNXDNConvolution conv;
  CNXDNConvolution *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff8c;
  uint local_54;
  int local_50;
  CNXDNConvolution local_40;
  byte local_1;
  
  CNXDNConvolution::CNXDNConvolution(in_stack_ffffffffffffff80);
  CNXDNConvolution::start(in_stack_ffffffffffffff80);
  local_50 = 0;
  for (local_54 = 0; local_54 < 0xcf; local_54 = local_54 + 1) {
    lVar1 = (long)local_50;
    iVar2 = local_50 + 1;
    local_50 = local_50 + 2;
    CNXDNConvolution::decode
              (&local_40,*(uint8_t *)((long)&in_RDI[9].m_newMetrics + lVar1 + 6),
               *(uint8_t *)((long)&in_RDI[9].m_newMetrics + (long)iVar2 + 6));
  }
  CNXDNConvolution::chainback(&local_40,(uchar *)((long)&in_RDI[0x12].m_oldMetrics + 2),0xcb);
  local_1 = CNXDNCRC::checkCRC15((uchar *)in_RDI,in_stack_ffffffffffffff8c);
  if (!(bool)local_1) {
    this_00 = std::operator<<((ostream *)&std::cerr,"DSDNXDN::UDCH::decode: bad CRC");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  CNXDNConvolution::~CNXDNConvolution(in_RDI);
  return (bool)(local_1 & 1);
}

Assistant:

bool DSDNXDN::UDCH::decode()
{
    CNXDNConvolution conv;
    conv.start();
    int n = 0;

    for (unsigned int i = 0U; i < 207U; i++)
    {
        uint8_t s0 = m_temp[n++];
        uint8_t s1 = m_temp[n++];

        conv.decode(s0, s1);
    }

    conv.chainback(m_data, 203U);

    if (!CNXDNCRC::checkCRC15(m_data, 184))
    {
        std::cerr << "DSDNXDN::UDCH::decode: bad CRC" << std::endl;
        return false;
    }
    else
    {
        return true;
    }
}